

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O2

Expression __thiscall cnn::GRUBuilder::add_input_impl(GRUBuilder *this,int prev,Expression *x)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  undefined4 in_register_00000034;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  double __x;
  double __x_00;
  Expression EVar9;
  Expression ct;
  undefined1 local_140 [8];
  ulong local_138;
  Expression zt;
  Expression nwt;
  Expression ght;
  Expression h_tprev;
  Expression ft;
  Expression crt;
  initializer_list<cnn::expr::Expression> local_68;
  GRUBuilder *local_58;
  long local_50;
  long *local_48;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_40;
  ulong local_38;
  
  lVar4 = CONCAT44(in_register_00000034,prev);
  lVar1 = *(long *)(lVar4 + 0x70);
  lVar5 = *(long *)(lVar4 + 0x78);
  local_58 = this;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&nwt,
             (ulong)*(uint *)(lVar4 + 0x8c),(allocator_type *)&h_tprev);
  local_40 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar4 + 0x58);
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            ((vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar4 + 0x58),
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&nwt);
  local_48 = (long *)(lVar4 + 0x70);
  bVar7 = lVar5 != lVar1;
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            ((_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&nwt);
  lVar1 = *(long *)(lVar4 + 0x60);
  bVar8 = -1 < (int)x;
  lVar5 = 8;
  lVar6 = 0;
  local_50 = ((ulong)x & 0xffffffff) * 0x18;
  for (local_38 = 0; local_38 < *(uint *)(lVar4 + 0x8c); local_38 = local_38 + 1) {
    lVar3 = *(long *)(lVar4 + 0x40);
    h_tprev.pg = (ComputationGraph *)0x0;
    h_tprev.i.t = 0;
    if (bVar8 || bVar7) {
      plVar2 = (long *)(*(long *)local_40 + local_50);
      if ((int)x < 0) {
        plVar2 = local_48;
      }
      h_tprev.pg = *(ComputationGraph **)(*plVar2 + -8 + lVar5);
      h_tprev.i.t = *(uint *)(*plVar2 + lVar5);
      nwt.pg = *(ComputationGraph **)(*(long *)(lVar3 + lVar6) + 0x20);
      nwt.i.t = *(uint *)(*(long *)(lVar3 + lVar6) + 0x28);
      local_138 = 5;
    }
    else {
      nwt.pg = *(ComputationGraph **)(*(long *)(lVar3 + lVar6) + 0x20);
      nwt.i.t = *(uint *)(*(long *)(lVar3 + lVar6) + 0x28);
      local_138 = 3;
    }
    zt.i.t = 0;
    zt.pg = (ComputationGraph *)0x0;
    local_140 = (undefined1  [8])&nwt;
    cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&ft,(initializer_list<cnn::expr::Expression> *)local_140);
    zt.pg = ft.pg;
    zt.i = ft.i;
    cnn::expr::logistic((expr *)&nwt,&zt);
    zt.pg = nwt.pg;
    zt.i = nwt.i;
    cnn::expr::operator-((expr *)&ft,1.0,&zt);
    local_140 = (undefined1  [8])0x0;
    local_138 = local_138 & 0xffffffff00000000;
    if (bVar8 || bVar7) {
      nwt.pg = *(ComputationGraph **)(*(long *)(lVar3 + lVar6) + 0x50);
      nwt.i.t = *(uint *)(*(long *)(lVar3 + lVar6) + 0x58);
      ght.i.t = 5;
      ght._12_4_ = 0;
    }
    else {
      nwt.pg = *(ComputationGraph **)(*(long *)(lVar3 + lVar6) + 0x50);
      nwt.i.t = *(uint *)(*(long *)(lVar3 + lVar6) + 0x58);
      ght.i.t = 3;
      ght._12_4_ = 0;
    }
    ght.pg = (ComputationGraph *)&nwt;
    cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&ct,(initializer_list<cnn::expr::Expression> *)&ght);
    local_140 = (undefined1  [8])ct.pg;
    local_138._0_4_ = ct.i.t;
    cnn::expr::logistic((expr *)&nwt,(Expression *)local_140);
    local_140 = (undefined1  [8])nwt.pg;
    local_138 = CONCAT44(local_138._4_4_,nwt.i.t);
    ct.pg = (ComputationGraph *)0x0;
    ct.i.t = 0;
    if (bVar8 || bVar7) {
      cnn::expr::cwise_multiply((expr *)&ght,(Expression *)local_140,&h_tprev);
      nwt.pg = *(ComputationGraph **)(*(long *)(lVar3 + lVar6) + 0x80);
      nwt.i.t = *(uint *)(*(long *)(lVar3 + lVar6) + 0x88);
      local_68._M_len = 5;
      local_68._M_array = (iterator)&nwt;
      cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&crt,&local_68);
      ct.pg = crt.pg;
      ct.i = crt.i;
      cnn::expr::tanh((expr *)&nwt,__x_00);
      ct.pg = nwt.pg;
      ct.i = nwt.i;
      cnn::expr::cwise_multiply((expr *)&nwt,&zt,&ct);
      cnn::expr::cwise_multiply((expr *)&crt,&ft,&h_tprev);
      cnn::expr::operator+((expr *)&local_68,&crt,&nwt);
      lVar3 = *(long *)(lVar1 + -0x18);
      *(iterator *)(lVar3 + -8 + lVar5) = local_68._M_array;
      nwt.i.t = (uint)local_68._M_len;
    }
    else {
      nwt.pg = *(ComputationGraph **)(*(long *)(lVar3 + lVar6) + 0x80);
      nwt.i.t = *(uint *)(*(long *)(lVar3 + lVar6) + 0x88);
      crt.i.t = 3;
      crt._12_4_ = 0;
      crt.pg = (ComputationGraph *)&nwt;
      cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&ght,(initializer_list<cnn::expr::Expression> *)&crt);
      ct.pg = ght.pg;
      ct.i = ght.i;
      cnn::expr::tanh((expr *)&nwt,__x);
      ct.pg = nwt.pg;
      ct.i = nwt.i;
      cnn::expr::cwise_multiply((expr *)&nwt,&zt,&ct);
      lVar3 = *(long *)(lVar1 + -0x18);
      *(ComputationGraph **)(lVar3 + -8 + lVar5) = nwt.pg;
    }
    *(uint *)(lVar3 + lVar5) = nwt.i.t;
    lVar6 = lVar6 + 0x18;
    lVar5 = lVar5 + 0x10;
  }
  lVar1 = *(long *)(lVar1 + -0x10);
  (local_58->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar1 + -0x10);
  (local_58->super_RNNBuilder).cur.t = *(int *)(lVar1 + -8);
  EVar9._8_8_ = lVar1;
  EVar9.pg = (ComputationGraph *)local_58;
  return EVar9;
}

Assistant:

Expression GRUBuilder::add_input_impl(int prev, const Expression& x) {
  const bool has_initial_state = (h0.size() > 0);
  h.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression h_tprev;
    // prev_zero means that h_tprev should be treated as 0
    bool prev_zero = false;
    if (prev >= 0 || has_initial_state) {
      h_tprev = (prev < 0) ? h0[i] : h[prev][i];
    } else { prev_zero = true; }
    // update gate
    Expression zt;
    if (prev_zero)
      zt = affine_transform({vars[BZ], vars[X2Z], in});
    else
      zt = affine_transform({vars[BZ], vars[X2Z], in, vars[H2Z], h_tprev});
    zt = logistic(zt);
    // forget
    Expression ft = 1.f - zt;
    // reset gate
    Expression rt;
    if (prev_zero)
      rt = affine_transform({vars[BR], vars[X2R], in});
    else
      rt = affine_transform({vars[BR], vars[X2R], in, vars[H2R], h_tprev});
    rt = logistic(rt);

    // candidate activation
    Expression ct;
    if (prev_zero) {
      ct = affine_transform({vars[BH], vars[X2H], in});
      ct = tanh(ct);
      Expression nwt = cwise_multiply(zt, ct);
      in = ht[i] = nwt;
    } else {
      Expression ght = cwise_multiply(rt, h_tprev);
      ct = affine_transform({vars[BH], vars[X2H], in, vars[H2H], ght});
      ct = tanh(ct);
      Expression nwt = cwise_multiply(zt, ct);
      Expression crt = cwise_multiply(ft, h_tprev);
      in = ht[i] = crt + nwt;
    }
  }
  return ht.back();
}